

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void ordinary(parse *p,int ch)

{
  int iVar1;
  cat_t *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  ushort **ppuVar6;
  long opnd;
  char local_2b [3];
  
  pcVar2 = p->g->categories;
  opnd = (long)ch;
  if ((((p->g->cflags & 2) == 0) ||
      (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + opnd * 2 + 1) & 4) == 0)) ||
     (cVar5 = othercase(ch), cVar5 == ch)) {
    doemit(p,0x8000000,opnd);
    if (pcVar2[opnd] == '\0') {
      iVar1 = p->g->ncategories;
      p->g->ncategories = iVar1 + 1;
      pcVar2[opnd] = (cat_t)iVar1;
    }
    return;
  }
  pcVar3 = p->next;
  pcVar4 = p->end;
  cVar5 = othercase(ch);
  if (cVar5 == ch) {
    __assert_fail("othercase(ch) != ch",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x3dd,"void bothcases()");
  }
  p->next = local_2b;
  p->end = local_2b + 2;
  local_2b[0] = (char)ch;
  local_2b[1] = ']';
  local_2b[2] = '\0';
  p_bracket(p);
  if (p->next == local_2b + 2) {
    p->next = pcVar3;
    p->end = pcVar4;
    return;
  }
  __assert_fail("p->next == bracket+2",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                ,0x3e4,"void bothcases()");
}

Assistant:

static void
ordinary(p, ch)
struct parse *p;
int ch;
{
	cat_t *cap = p->g->categories;

	if ((p->g->cflags&REG_ICASE) && isalpha(ch) && othercase(ch) != ch)
		bothcases(p, ch);
	else {
		EMIT(OCHAR, (sopno)ch);
		if (cap[ch] == 0)
			cap[ch] = (cat_t)(p->g->ncategories++);
	}
}